

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

void fillBackground(QPainter *p,QRectF *rect,QBrush *brush,QPointF *origin,QRectF *gradientRect)

{
  QGradient *this;
  long lVar1;
  qreal *pqVar2;
  QTransform *pQVar3;
  long in_FS_OFFSET;
  byte bVar4;
  QTransform m;
  QTransform local_80;
  long local_30;
  
  bVar4 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::save(p);
  if (((brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->style - LinearGradientPattern < 3)
  {
    if ((((gradientRect->w != 0.0) || (NAN(gradientRect->w))) || (gradientRect->h != 0.0)) ||
       (NAN(gradientRect->h))) {
      pqVar2 = (qreal *)&DAT_006bc930;
      pQVar3 = &local_80;
      for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
        pQVar3->m_matrix[0][0] = *pqVar2;
        pqVar2 = pqVar2 + (ulong)bVar4 * -2 + 1;
        pQVar3 = (QTransform *)((long)pQVar3 + ((ulong)bVar4 * -2 + 1) * 8);
      }
      pqVar2 = (qreal *)&DAT_006bc980;
      pQVar3 = &local_80;
      for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
        pQVar3->m_matrix[0][0] = *pqVar2;
        pqVar2 = pqVar2 + (ulong)bVar4 * -2 + 1;
        pQVar3 = (QTransform *)((long)pQVar3 + ((ulong)bVar4 * -2 + 1) * 8);
      }
      local_80._72_2_ = local_80._72_2_ & 0xfc00;
      QTransform::translate(&local_80,gradientRect->xp,gradientRect->yp);
      QTransform::scale(&local_80,gradientRect->w,gradientRect->h);
      QBrush::setTransform(brush,&local_80);
      this = QBrush::gradient(brush);
      QGradient::setCoordinateMode(this,LogicalMode);
    }
  }
  else {
    QPainter::setBrushOrigin(p,origin);
  }
  QPainter::fillRect(p,rect,brush);
  QPainter::restore(p);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fillBackground(QPainter *p, const QRectF &rect, QBrush brush, const QPointF &origin, const QRectF &gradientRect = QRectF())
{
    p->save();
    if (brush.style() >= Qt::LinearGradientPattern && brush.style() <= Qt::ConicalGradientPattern) {
        if (!gradientRect.isNull()) {
            QTransform m;
            m.translate(gradientRect.left(), gradientRect.top());
            m.scale(gradientRect.width(), gradientRect.height());
            brush.setTransform(m);
            const_cast<QGradient *>(brush.gradient())->setCoordinateMode(QGradient::LogicalMode);
        }
    } else {
        p->setBrushOrigin(origin);
    }
    p->fillRect(rect, brush);
    p->restore();
}